

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CoreML::FeatureType::toDictionary_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FeatureType *this)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer plVar3;
  mapped_type *pmVar4;
  ImageFeatureType *params;
  ImageFeatureType_ImageSizeRange *pIVar5;
  DictionaryFeatureType *pDVar6;
  SequenceFeatureType *pSVar7;
  SizeRange *pSVar8;
  ArrayFeatureType *params_00;
  ArrayFeatureType_ShapeRange *pAVar9;
  Type *pTVar10;
  ArrayFeatureType_EnumeratedShapes *pAVar11;
  Type *pTVar12;
  ImageFeatureType_EnumeratedImageSizes *pIVar13;
  Type *pTVar14;
  undefined1 uVar15;
  long lVar16;
  TypeCase in_EDX;
  ImageFeatureType_ColorSpace colorspace;
  KeyTypeCase tag;
  TypeCase seqType;
  ArrayFeatureType_ArrayDataType dataType;
  int d;
  int index;
  int i;
  int iVar17;
  undefined1 in_R8B;
  allocator<char> local_b1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  vector<long,_std::allocator<long>_> size;
  key_type local_88;
  vector<long,_std::allocator<long>_> defaultSize;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> ranges;
  
  uVar2 = ((this->m_type).
           super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_oneof_case_[0];
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = __return_storage_ptr__;
  featureTypeToString_abi_cxx11_((string *)&size,(CoreML *)(ulong)uVar2,in_EDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"type",(allocator<char> *)&defaultSize);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_b0,&local_88);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&size,"isOptional",(allocator<char> *)&local_88);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_b0,(key_type *)&size);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&size);
  if (3 < uVar2 - 4) {
    return local_b0;
  }
  lVar16 = (long)&switchD_0021486c::switchdataD_002b5df8 +
           (long)(int)(&switchD_0021486c::switchdataD_002b5df8)[uVar2 - 4];
  switch(uVar2) {
  case 4:
    params = Specification::FeatureType::imagetype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    defaultSizeOf(&defaultSize,params);
    std::__cxx11::to_string
              ((string *)&size,
               *defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"width",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::to_string
              ((string *)&size,
               defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[1]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"height",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    colorSpaceToString_abi_cxx11_
              ((string *)&size,(CoreML *)(ulong)(uint)params->colorspace_,colorspace);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"colorspace",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&size,"isColor",(allocator<char> *)&local_88);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,(key_type *)&size);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&size,"hasSizeFlexibility",(allocator<char> *)&local_88);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,(key_type *)&size);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&size);
    uVar15 = (undefined1)lVar16;
    if (params->_oneof_case_[0] == 0x15) {
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar17 = 0;
      while( true ) {
        pIVar13 = Specification::ImageFeatureType::enumeratedsizes(params);
        uVar15 = (undefined1)lVar16;
        if ((pIVar13->sizes_).super_RepeatedPtrFieldBase.current_size_ <= iVar17) break;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pIVar13 = Specification::ImageFeatureType::enumeratedsizes(params);
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar13->sizes_).super_RepeatedPtrFieldBase,iVar17);
        local_88._M_dataplus._M_p = (pointer)pTVar14->width_;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)
                   &size.super__Vector_base<long,_std::allocator<long>_>,(long *)&local_88);
        pIVar13 = Specification::ImageFeatureType::enumeratedsizes(params);
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar13->sizes_).super_RepeatedPtrFieldBase,iVar17);
        local_88._M_dataplus._M_p = (pointer)pTVar14->height_;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)
                   &size.super__Vector_base<long,_std::allocator<long>_>,(long *)&local_88);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&ranges,(value_type *)&size.super__Vector_base<long,_std::allocator<long>_>);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&size.super__Vector_base<long,_std::allocator<long>_>);
        iVar17 = iVar17 + 1;
      }
      enumeratedShapesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&ranges,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"enumeratedSizes",&local_b1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      enumeratedShapesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&ranges,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"sizeFlexibility",&local_b1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&ranges);
    }
    else if (params->_oneof_case_[0] == 0x1f) {
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ranges.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar5 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar8 = pIVar5->widthrange_;
      if (pSVar8 == (SizeRange *)0x0) {
        pSVar8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      plVar3 = (pointer)pSVar8->lowerbound_;
      pIVar5 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar8 = pIVar5->widthrange_;
      if (pSVar8 == (SizeRange *)0x0) {
        pSVar8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)pSVar8->upperbound_;
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = plVar3;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      emplace_back<std::pair<long,long>>
                ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&ranges,
                 (pair<long,_long> *)&size);
      pIVar5 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar8 = pIVar5->heightrange_;
      if (pSVar8 == (SizeRange *)0x0) {
        pSVar8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      plVar3 = (pointer)pSVar8->lowerbound_;
      pIVar5 = Specification::ImageFeatureType::imagesizerange(params);
      pSVar8 = pIVar5->heightrange_;
      if (pSVar8 == (SizeRange *)0x0) {
        pSVar8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)pSVar8->upperbound_;
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = plVar3;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      emplace_back<std::pair<long,long>>
                ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&ranges,
                 (pair<long,_long> *)&size);
      dimensionRangesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&ranges,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
                 (bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"sizeRange",&local_b1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      dimensionRangesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&ranges,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
                 (bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"sizeFlexibility",&local_b1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
      ~_Vector_base(&ranges.
                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   );
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&defaultSize.super__Vector_base<long,_std::allocator<long>_>);
    return local_b0;
  case 5:
    params_00 = Specification::FeatureType::multiarraytype
                          ((this->m_type).
                           super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
    dataTypeToString_abi_cxx11_
              ((string *)&size,(CoreML *)(ulong)(uint)params_00->datatype_,dataType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"dataType",(allocator<char> *)&defaultSize);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    defaultShapeOf(&defaultSize,params_00);
    dimensionsToString_abi_cxx11_
              ((string *)&size,(CoreML *)&defaultSize,(vector<long,_std::allocator<long>_> *)0x1,
               SUB81(lVar16,0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"shape",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&defaultSize.super__Vector_base<long,_std::allocator<long>_>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&size,"hasShapeFlexibility",(allocator<char> *)&local_88);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,(key_type *)&size);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&size);
    if (params_00->_oneof_case_[0] == 0x15) {
      defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      iVar17 = 0;
      while( true ) {
        pAVar11 = Specification::ArrayFeatureType::enumeratedshapes(params_00);
        uVar15 = (undefined1)lVar16;
        if ((pAVar11->shapes_).super_RepeatedPtrFieldBase.current_size_ <= iVar17) break;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        index = 0;
        while( true ) {
          pAVar11 = Specification::ArrayFeatureType::enumeratedshapes(params_00);
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar11->shapes_).super_RepeatedPtrFieldBase,iVar17);
          if ((pTVar12->shape_).current_size_ <= index) break;
          pAVar11 = Specification::ArrayFeatureType::enumeratedshapes(params_00);
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar11->shapes_).super_RepeatedPtrFieldBase,iVar17);
          local_88._M_dataplus._M_p =
               (pointer)Specification::ArrayFeatureType_Shape::shape(pTVar12,index);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)
                     &size.super__Vector_base<long,_std::allocator<long>_>,(long *)&local_88);
          index = index + 1;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&defaultSize,
                    (value_type *)&size.super__Vector_base<long,_std::allocator<long>_>);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&size.super__Vector_base<long,_std::allocator<long>_>);
        iVar17 = iVar17 + 1;
      }
      enumeratedShapesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&defaultSize,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"enumeratedShapes",(allocator<char> *)&ranges);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      enumeratedShapesToString_abi_cxx11_
                ((string *)&size,(CoreML *)&defaultSize,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"shapeFlexibility",(allocator<char> *)&ranges);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_88);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&size);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&defaultSize);
      return local_b0;
    }
    if (params_00->_oneof_case_[0] != 0x1f) {
      return local_b0;
    }
    defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar17 = 0;
    while( true ) {
      pAVar9 = Specification::ArrayFeatureType::shaperange(params_00);
      uVar15 = (undefined1)lVar16;
      if ((pAVar9->sizeranges_).super_RepeatedPtrFieldBase.current_size_ <= iVar17) break;
      pAVar9 = Specification::ArrayFeatureType::shaperange(params_00);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          (&(pAVar9->sizeranges_).super_RepeatedPtrFieldBase,iVar17);
      plVar3 = (pointer)pTVar10->lowerbound_;
      pAVar9 = Specification::ArrayFeatureType::shaperange(params_00);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          (&(pAVar9->sizeranges_).super_RepeatedPtrFieldBase,iVar17);
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)pTVar10->upperbound_;
      size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = plVar3;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      emplace_back<std::pair<long,long>>
                ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&defaultSize,
                 (pair<long,_long> *)&size);
      iVar17 = iVar17 + 1;
    }
    dimensionRangesToString_abi_cxx11_
              ((string *)&size,(CoreML *)&defaultSize,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
               (bool)uVar15);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"shapeRange",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    dimensionRangesToString_abi_cxx11_
              ((string *)&size,(CoreML *)&defaultSize,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
               (bool)uVar15);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"shapeFlexibility",(allocator<char> *)&ranges);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              ((_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
               &defaultSize);
    return local_b0;
  case 6:
    pDVar6 = Specification::FeatureType::dictionarytype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    keyTypeToString_abi_cxx11_((string *)&size,(CoreML *)(ulong)pDVar6->_oneof_case_[0],tag);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"keyType",(allocator<char> *)&defaultSize);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    break;
  case 7:
    pSVar7 = Specification::FeatureType::sequencetype
                       ((this->m_type).
                        super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    sequenceTypeToString_abi_cxx11_
              ((string *)&size,(CoreML *)(ulong)pSVar7->_oneof_case_[0],seqType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"valueType",(allocator<char> *)&defaultSize);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&size);
    pSVar8 = pSVar7->sizerange_;
    if (pSVar8 == (SizeRange *)0x0) {
      pSVar8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    rangeToString_abi_cxx11_
              ((string *)&size,(CoreML *)pSVar8->lowerbound_,pSVar8->upperbound_,1,(bool)in_R8B);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"sizeRange",(allocator<char> *)&defaultSize);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b0,&local_88);
  }
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&size);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&size);
  return local_b0;
}

Assistant:

std::map<std::string,std::string> FeatureType::toDictionary() const {
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        std::map<std::string, std::string> dict;
        dict["type"] = featureTypeToString(tag);
        dict["isOptional"] = m_type->isoptional() ? "1" : "0";

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                dict["dataType"] = dataTypeToString(params.datatype());
                dict["shape"] = dimensionsToString(defaultShapeOf(params),true);
                dict["hasShapeFlexibility"] = params.ShapeFlexibility_case() != Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.ShapeFlexibility_case()) {
                    case Specification::ArrayFeatureType::kEnumeratedShapes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedShapesOf(params);
                        dict["enumeratedShapes"] = enumeratedShapesToString(shapes,true);
                        dict["shapeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::kShapeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = shapeRangesOf(params);
                        dict["shapeRange"] = dimensionRangesToString(ranges,true);
                        dict["shapeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                dict["keyType"] = keyTypeToString(m_type->dictionarytype().KeyType_case());
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                auto defaultSize = defaultSizeOf(params);
                dict["width"] = std::to_string(defaultSize[0]);
                dict["height"] = std::to_string(defaultSize[1]);
                dict["colorspace"] = colorSpaceToString(params.colorspace());
                dict["isColor"] = (params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                                   params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) ? "0" : "1";
                dict["hasSizeFlexibility"] = params.SizeFlexibility_case() != Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.SizeFlexibility_case()) {
                    case Specification::ImageFeatureType::kEnumeratedSizes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedSizesOf(params);
                        dict["enumeratedSizes"] = enumeratedShapesToString(shapes,true);
                        dict["sizeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ImageFeatureType::kImageSizeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = sizeRangesOf(params);
                        dict["sizeRange"] = dimensionRangesToString(ranges,true);
                        dict["sizeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                dict["valueType"] = sequenceTypeToString(params.Type_case());
                dict["sizeRange"] = rangeToString((int64_t)params.sizerange().lowerbound(), params.sizerange().upperbound(),true);
                break;
            }
            default:
                break;
        }

        return dict;
    }